

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

bool __thiscall
Darts::Details::DawgBuilder::are_equal(DawgBuilder *this,id_type node_id,id_type unit_id)

{
  uint uVar1;
  id_type iVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  bool bVar6;
  
  pcVar5 = (this->nodes_).buf_.array_;
  uVar4 = (ulong)node_id;
  while( true ) {
    lVar3 = uVar4 * 0xc;
    uVar4 = (ulong)*(uint *)(pcVar5 + lVar3 + 4);
    uVar1 = *(uint *)((this->units_).buf_.array_ + (ulong)unit_id * 4);
    if (*(uint *)(pcVar5 + lVar3 + 4) == 0) break;
    if ((uVar1 & 1) == 0) goto LAB_0022943d;
    unit_id = unit_id + 1;
  }
  if ((uVar1 & 1) == 0) {
    while (bVar6 = node_id == 0, !bVar6) {
      lVar3 = (ulong)node_id * 0xc;
      iVar2 = DawgNode::unit((DawgNode *)(pcVar5 + lVar3));
      if (iVar2 != *(id_type *)((this->units_).buf_.array_ + (ulong)unit_id * 4)) {
        return bVar6;
      }
      pcVar5 = (this->nodes_).buf_.array_;
      if (pcVar5[lVar3 + 8] != (this->labels_).buf_.array_[unit_id]) {
        return bVar6;
      }
      unit_id = unit_id - 1;
      node_id = *(id_type *)(pcVar5 + lVar3 + 4);
    }
  }
  else {
LAB_0022943d:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

inline bool DawgBuilder::are_equal(id_type node_id, id_type unit_id) const {
  for (id_type i = nodes_[node_id].sibling(); i != 0;
      i = nodes_[i].sibling()) {
    if (units_[unit_id].has_sibling() == false) {
      return false;
    }
    ++unit_id;
  }
  if (units_[unit_id].has_sibling() == true) {
    return false;
  }

  for (id_type i = node_id; i != 0; i = nodes_[i].sibling(), --unit_id) {
    if (nodes_[i].unit() != units_[unit_id].unit() ||
        nodes_[i].label() != labels_[unit_id]) {
      return false;
    }
  }
  return true;
}